

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

gpointer * g_ptr_array_steal(GPtrArray *array,gsize *len)

{
  gpointer *ppvVar1;
  gpointer *segment;
  GRealPtrArray *rarray;
  gsize *len_local;
  GPtrArray *array_local;
  
  ppvVar1 = array->pdata;
  if (len != (gsize *)0x0) {
    *len = (ulong)array->len;
  }
  array->pdata = (gpointer *)0x0;
  array->len = 0;
  *(undefined4 *)&array->field_0xc = 0;
  return ppvVar1;
}

Assistant:

gpointer *g_ptr_array_steal (GPtrArray *array, gsize *len)
{
    GRealPtrArray *rarray;
    gpointer *segment;

    g_return_val_if_fail (array != NULL, NULL);

    rarray = (GRealPtrArray *) array;
    segment = (gpointer *) rarray->pdata;

    if (len != NULL)
        *len = rarray->len;

    rarray->pdata = NULL;
    rarray->len   = 0;
    rarray->alloc = 0;
    return segment;
}